

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

CharSetNode * __thiscall
UnifiedRegex::CharSetLeaf::ClearRange
          (CharSetLeaf *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  ulong uVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  ulong uVar7;
  uint l_00;
  
  if (level == 0) {
    uVar5 = 0xff;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2e4,"(level == 0)","level == 0");
    if (!bVar4) goto LAB_00e5a93a;
    *puVar6 = 0;
    uVar5 = ~(-1 << ((char)level * '\x04' + 8U & 0x1f));
  }
  if (uVar5 < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2e5,"(h <= lim(level))",
                       "The range for clearing provided is invalid for this level.");
    if (!bVar4) goto LAB_00e5a93a;
    *puVar6 = 0;
  }
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x2e6,"(l <= h)","Can\'t clear where lower is bigger than the higher.");
    if (!bVar4) {
LAB_00e5a93a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  else if (l == 0) {
    l_00 = 0;
    if ((-1 << ((char)(level << 2) + 8U & 0x1f) ^ h) == 0xffffffff) {
      return (CharSetNode *)0x0;
    }
    goto LAB_00e5a8c3;
  }
  l_00 = l & 0xff;
LAB_00e5a8c3:
  CharBitvec::ClearRange(&this->vec,l_00,h & 0xff);
  if ((this->vec).vec[0] != 0) {
    return &this->super_CharSetNode;
  }
  uVar7 = 0xffffffffffffffff;
  do {
    if (uVar7 == 6) goto LAB_00e5a8f7;
    uVar1 = uVar7 + 1;
    lVar3 = uVar7 + 2;
    uVar7 = uVar1;
  } while ((this->vec).vec[lVar3] == 0);
  if (uVar1 < 7) {
    return &this->super_CharSetNode;
  }
LAB_00e5a8f7:
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             this,0x28);
  return (CharSetNode *)0x0;
}

Assistant:

CharSetNode* CharSetLeaf::ClearRange(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level == 0);
        AssertMsg(h <= lim(level), "The range for clearing provided is invalid for this level.");
        AssertMsg(l <= h, "Can't clear where lower is bigger than the higher.");
        if (l == 0 && h == lim(level))
        {
            return nullptr;
        }

        vec.ClearRange(leafIdx(l), leafIdx(h));

        if (vec.IsEmpty())
        {
            FreeSelf(allocator);
            return nullptr;
        }

        return this;
    }